

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkInsertNewLogic(Abc_Ntk_t *pNtkH,Abc_Ntk_t *pNtkL)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  Abc_Des_t *pAVar2;
  int iVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  char *pcVar9;
  Abc_Obj_t *pAVar10;
  Abc_Ntk_t *pAVar11;
  char *pName;
  int k;
  int i;
  Abc_Obj_t *pTermH;
  Abc_Obj_t *pNetL;
  Abc_Obj_t *pNetH;
  Abc_Obj_t *pObjL;
  Abc_Obj_t *pObjH;
  Abc_Ntk_t *pNtkNew;
  Abc_Des_t *pDesign;
  Abc_Ntk_t *pNtkL_local;
  Abc_Ntk_t *pNtkH_local;
  
  iVar3 = Abc_NtkIsNetlist(pNtkH);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtkH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2ba,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar3 = Abc_NtkWhiteboxNum(pNtkH);
  if (iVar3 != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkH) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,699,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar3 = Abc_NtkBlackboxNum(pNtkH);
  if (iVar3 < 1) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkH) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,700,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar3 = Abc_NtkIsNetlist(pNtkL);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtkL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2be,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar3 = Abc_NtkWhiteboxNum(pNtkL);
  if (iVar3 != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2bf,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar3 = Abc_NtkBlackboxNum(pNtkL);
  if (iVar3 != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2c0,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtkL);
  pNtkH_local = Abc_NtkAlloc(pNtkL->ntkType,pNtkL->ntkFunc,1);
  pcVar4 = Extra_UtilStrsav(pNtkH->pName);
  pNtkH_local->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtkH->pSpec);
  pNtkH_local->pSpec = pcVar4;
  for (pName._4_4_ = 0; iVar3 = Abc_NtkPiNum(pNtkH), pName._4_4_ < iVar3;
      pName._4_4_ = pName._4_4_ + 1) {
    pAVar5 = Abc_NtkPi(pNtkH,pName._4_4_);
    pAVar5 = Abc_ObjFanout0(pAVar5);
    pcVar4 = Abc_ObjName(pAVar5);
    pAVar10 = Abc_NtkFindNet(pNtkL,pcVar4);
    if (pAVar10 == (Abc_Obj_t *)0x0) {
LAB_00ad93b1:
      pcVar4 = Abc_ObjName(pAVar5);
      printf("Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n",pcVar4
            );
      Abc_NtkDelete(pNtkH_local);
      return (Abc_Ntk_t *)0x0;
    }
    pAVar6 = Abc_ObjFanin0(pAVar10);
    iVar3 = Abc_ObjIsPi(pAVar6);
    if (iVar3 == 0) goto LAB_00ad93b1;
    if ((pAVar10->field_6).pTemp != (void *)0x0) {
      pcVar4 = Abc_ObjName(pAVar5);
      printf("Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n",pcVar4);
      Abc_NtkDelete(pNtkH_local);
      return (Abc_Ntk_t *)0x0;
    }
    pcVar4 = Abc_ObjName(pAVar5);
    pAVar5 = Abc_NtkFindOrCreateNet(pNtkH_local,pcVar4);
    (pAVar10->field_6).pCopy = pAVar5;
    pAVar5 = Abc_ObjFanin0(pAVar10);
    Abc_NtkDupObj(pNtkH_local,pAVar5,0);
  }
  for (pName._4_4_ = 0; iVar3 = Vec_PtrSize(pNtkH->vBoxes), pName._4_4_ < iVar3;
      pName._4_4_ = pName._4_4_ + 1) {
    pAVar5 = Abc_NtkBox(pNtkH,pName._4_4_);
    iVar3 = Abc_ObjIsBlackbox(pAVar5);
    if (iVar3 != 0) {
      Abc_NtkDupBox(pNtkH_local,pAVar5,0);
      ((pAVar5->field_6).pCopy)->field_5 = pAVar5->field_5;
      for (pName._0_4_ = 0; iVar3 = Abc_ObjFanoutNum(pAVar5), (int)pName < iVar3;
          pName._0_4_ = (int)pName + 1) {
        pAVar10 = Abc_ObjFanout(pAVar5,(int)pName);
        pAVar6 = Abc_ObjFanout0(pAVar10);
        pcVar4 = Abc_ObjName(pAVar6);
        pAVar7 = Abc_NtkFindNet(pNtkL,pcVar4);
        if (pAVar7 == (Abc_Obj_t *)0x0) {
LAB_00ad95a4:
          pcVar4 = Abc_ObjName(pAVar6);
          pcVar9 = Abc_ObjName(pAVar5);
          printf("Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n"
                 ,pcVar4,pcVar9);
          Abc_NtkDelete(pNtkH_local);
          return (Abc_Ntk_t *)0x0;
        }
        pAVar8 = Abc_ObjFanin0(pAVar7);
        iVar3 = Abc_ObjIsPi(pAVar8);
        if (iVar3 == 0) goto LAB_00ad95a4;
        if ((pAVar7->field_6).pTemp != (void *)0x0) {
          pcVar4 = Abc_ObjName(pAVar6);
          printf("Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n",pcVar4);
          Abc_NtkDelete(pNtkH_local);
          return (Abc_Ntk_t *)0x0;
        }
        pcVar4 = Abc_ObjName(pAVar6);
        pAVar6 = Abc_NtkFindOrCreateNet(pNtkH_local,pcVar4);
        (pAVar7->field_6).pCopy = pAVar6;
        aVar1 = pAVar10->field_6;
        pAVar10 = Abc_ObjFanin0(pAVar7);
        pAVar10->field_6 = aVar1;
      }
    }
  }
  pName._4_4_ = 0;
  do {
    iVar3 = Abc_NtkPoNum(pNtkH);
    if (iVar3 <= pName._4_4_) {
      pName._4_4_ = 0;
      do {
        iVar3 = Vec_PtrSize(pNtkH->vBoxes);
        if (iVar3 <= pName._4_4_) {
          for (pName._4_4_ = 0; iVar3 = Vec_PtrSize(pNtkL->vObjs), pName._4_4_ < iVar3;
              pName._4_4_ = pName._4_4_ + 1) {
            pAVar5 = Abc_NtkObj(pNtkL,pName._4_4_);
            if (((pAVar5 != (Abc_Obj_t *)0x0) && ((pAVar5->field_6).pTemp == (void *)0x0)) &&
               (iVar3 = Abc_ObjIsPo(pAVar5), iVar3 == 0)) {
              iVar3 = Abc_ObjIsNet(pAVar5);
              Abc_NtkDupObj(pNtkH_local,pAVar5,iVar3);
            }
          }
          for (pName._4_4_ = 0; iVar3 = Vec_PtrSize(pNtkL->vObjs), pName._4_4_ < iVar3;
              pName._4_4_ = pName._4_4_ + 1) {
            pAVar5 = Abc_NtkObj(pNtkL,pName._4_4_);
            if (pAVar5 != (Abc_Obj_t *)0x0) {
              for (pName._0_4_ = 0; iVar3 = Abc_ObjFaninNum(pAVar5), (int)pName < iVar3;
                  pName._0_4_ = (int)pName + 1) {
                pAVar10 = Abc_ObjFanin(pAVar5,(int)pName);
                if ((pAVar5->field_6).pTemp != (void *)0x0) {
                  Abc_ObjAddFanin((pAVar5->field_6).pCopy,(pAVar10->field_6).pCopy);
                }
              }
            }
          }
          pAVar2 = pNtkH->pDesign;
          pNtkH->pDesign = (Abc_Des_t *)0x0;
          pAVar11 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar2->vModules,0);
          if (pAVar11 == pNtkH) {
            Vec_PtrWriteEntry(pAVar2->vModules,0,pNtkH_local);
            pNtkH_local->pDesign = pAVar2;
            iVar3 = Abc_NtkCheck(pNtkH_local);
            if (iVar3 == 0) {
              fprintf(_stdout,"Abc_NtkInsertNewLogic(): Network check has failed.\n");
              Abc_NtkDelete(pNtkH_local);
              pNtkH_local = (Abc_Ntk_t *)0x0;
            }
            return pNtkH_local;
          }
          __assert_fail("Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                        ,0x337,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        pAVar5 = Abc_NtkBox(pNtkH,pName._4_4_);
        iVar3 = Abc_ObjIsBlackbox(pAVar5);
        if (iVar3 != 0) {
          for (pName._0_4_ = 0; iVar3 = Abc_ObjFaninNum(pAVar5), (int)pName < iVar3;
              pName._0_4_ = (int)pName + 1) {
            pAVar10 = Abc_ObjFanin(pAVar5,(int)pName);
            pAVar6 = Abc_ObjFanin0(pAVar10);
            Abc_ObjName(pAVar6);
            pcVar4 = Abc_ObjName(pAVar6);
            pAVar7 = Abc_NtkFindNet(pNtkL,pcVar4);
            if (pAVar7 == (Abc_Obj_t *)0x0) {
LAB_00ad98f7:
              pcVar4 = Abc_ObjName(pAVar6);
              pcVar9 = Abc_ObjName(pAVar5);
              printf("There is no PO corresponding to the input %s of blackbox %s.\n",pcVar4,pcVar9)
              ;
              Abc_NtkDelete(pNtkH_local);
              return (Abc_Ntk_t *)0x0;
            }
            pAVar8 = Abc_ObjFanout0(pAVar7);
            iVar3 = Abc_ObjIsPo(pAVar8);
            if (iVar3 == 0) goto LAB_00ad98f7;
            if ((pAVar7->field_6).pTemp == (void *)0x0) {
              pcVar4 = Abc_ObjName(pAVar6);
              pAVar6 = Abc_NtkFindOrCreateNet(pNtkH_local,pcVar4);
              (pAVar7->field_6).pCopy = pAVar6;
              aVar1 = pAVar10->field_6;
              pAVar10 = Abc_ObjFanout0(pAVar7);
              pAVar10->field_6 = aVar1;
            }
            else {
              pAVar6 = Abc_ObjFanout0(pAVar7);
              if ((pAVar6->field_6).pTemp == (void *)0x0) {
                aVar1 = pAVar10->field_6;
                pAVar10 = Abc_ObjFanout0(pAVar7);
                pAVar10->field_6 = aVar1;
              }
              else {
                Abc_ObjAddFanin((pAVar10->field_6).pCopy,(pAVar7->field_6).pCopy);
              }
            }
          }
        }
        pName._4_4_ = pName._4_4_ + 1;
      } while( true );
    }
    pAVar5 = Abc_NtkPo(pNtkH,pName._4_4_);
    pAVar5 = Abc_ObjFanin0(pAVar5);
    pcVar4 = Abc_ObjName(pAVar5);
    pAVar10 = Abc_NtkFindNet(pNtkL,pcVar4);
    if (pAVar10 == (Abc_Obj_t *)0x0) {
LAB_00ad973c:
      pcVar4 = Abc_ObjName(pAVar5);
      printf("Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n",pcVar4
            );
      Abc_NtkDelete(pNtkH_local);
      return (Abc_Ntk_t *)0x0;
    }
    pAVar6 = Abc_ObjFanout0(pAVar10);
    iVar3 = Abc_ObjIsPo(pAVar6);
    if (iVar3 == 0) goto LAB_00ad973c;
    if ((pAVar10->field_6).pTemp == (void *)0x0) {
      pcVar4 = Abc_ObjName(pAVar5);
      pAVar5 = Abc_NtkFindOrCreateNet(pNtkH_local,pcVar4);
      (pAVar10->field_6).pCopy = pAVar5;
      pAVar5 = Abc_ObjFanout0(pAVar10);
      Abc_NtkDupObj(pNtkH_local,pAVar5,0);
    }
    pName._4_4_ = pName._4_4_ + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkInsertNewLogic( Abc_Ntk_t * pNtkH, Abc_Ntk_t * pNtkL )
{
    Abc_Des_t * pDesign;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjH, * pObjL, * pNetH, * pNetL, * pTermH;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtkH) );
    assert( Abc_NtkWhiteboxNum(pNtkH) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkH) > 0 );

    assert( Abc_NtkIsNetlist(pNtkL) );
    assert( Abc_NtkWhiteboxNum(pNtkL) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkL) == 0 );

    // prepare the logic network for copying
    Abc_NtkCleanCopy( pNtkL );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtkL->ntkType, pNtkL->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtkH->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtkH->pSpec );

    // make sure every PI/PO has a PI/PO in the processed network
    Abc_NtkForEachPi( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanout0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanin0(pNetL), 0 );
    }

    // make sure every BB has a PI/PO in the processed network
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        // duplicate the box 
        Abc_NtkDupBox( pNtkNew, pObjH, 0 );
        pObjH->pCopy->pData = pObjH->pData;
        // create PIs
        Abc_ObjForEachFanout( pObjH, pTermH, k )
        {
            pNetH = Abc_ObjFanout0( pTermH );
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            if ( pNetL->pCopy )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n", Abc_ObjName(pNetH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PI
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanin0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    Abc_NtkForEachPo( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanin0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
            continue;
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanout0(pNetL), 0 );
    }
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        Abc_ObjForEachFanin( pObjH, pTermH, k )
        {
            char * pName;
            pNetH = Abc_ObjFanin0( pTermH );
            pName = Abc_ObjName(pNetH);
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
            {
                printf( "There is no PO corresponding to the input %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PO
            if ( pNetL->pCopy )
            {
                if ( Abc_ObjFanout0(pNetL)->pCopy == NULL )
                    Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
                else
                    Abc_ObjAddFanin( pTermH->pCopy, pNetL->pCopy );
                continue;
            }
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    // duplicate other objects of the logic network
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        if ( pObjL->pCopy == NULL && !Abc_ObjIsPo(pObjL) ) // skip POs feeding into PIs
            Abc_NtkDupObj( pNtkNew, pObjL, Abc_ObjIsNet(pObjL) );

    // connect objects
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        Abc_ObjForEachFanin( pObjL, pNetL, k )
            if ( pObjL->pCopy )
                Abc_ObjAddFanin( pObjL->pCopy, pNetL->pCopy );

    // transfer the design
    pDesign = pNtkH->pDesign;  pNtkH->pDesign = NULL;
    assert( Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH );
    Vec_PtrWriteEntry( pDesign->vModules, 0, pNtkNew );
    pNtkNew->pDesign = pDesign;

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkInsertNewLogic(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}